

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynlink.c
# Opt level: O3

char * dynlink_print_info(void)

{
  return 
  "Dynamic Link Library 0.8.8\nCopyright (C) 2016 - 2025 Vicente Eduardo Ferrer Garcia <vic798@gmail.com>\nCompiled as shared library type\n"
  ;
}

Assistant:

const char *dynlink_print_info(void)
{
	static const char dynlink_info[] =
		"Dynamic Link Library " METACALL_VERSION "\n"
		"Copyright (C) 2016 - 2025 Vicente Eduardo Ferrer Garcia <vic798@gmail.com>\n"

#ifdef DYNLINK_STATIC_DEFINE
		"Compiled as static library type"
#else
		"Compiled as shared library type"
#endif

		"\n";

	return dynlink_info;
}